

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_read(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  size_t *psVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  uchar message;
  uchar level;
  char *pcVar7;
  
  if (ssl == (mbedtls_ssl_context *)0x0) {
    return -0x7100;
  }
  if (ssl->conf == (mbedtls_ssl_config *)0x0) {
    return -0x7100;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x18de,"=> read");
  if ((ssl->conf->field_0x164 & 2) != 0) {
    iVar4 = mbedtls_ssl_flush_output(ssl);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (((ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) &&
        (ssl->handshake->retransmit_state == '\x01')) &&
       (iVar4 = mbedtls_ssl_resend(ssl), iVar4 != 0)) {
      return iVar4;
    }
  }
  iVar4 = ssl_check_ctr_renegotiate(ssl);
  if (iVar4 != 0) {
    pcVar7 = "ssl_check_ctr_renegotiate";
    iVar5 = 0x18f2;
    goto LAB_00162903;
  }
  bVar3 = true;
  if (ssl->state != 0x10) {
    iVar4 = mbedtls_ssl_handshake(ssl);
    if (iVar4 == -0x6b00) {
      bVar3 = false;
    }
    else if (iVar4 != 0) {
      pcVar7 = "mbedtls_ssl_handshake";
      iVar5 = 0x1900;
      goto LAB_00162903;
    }
  }
  if (ssl->in_offt == (uchar *)0x0) {
    if ((ssl->f_get_timer != (_func_int_void_ptr *)0x0) &&
       (iVar4 = (*ssl->f_get_timer)(ssl->p_timer), iVar4 == -1)) {
      ssl_set_timer(ssl,ssl->conf->read_timeout);
    }
    if (bVar3) {
      iVar4 = mbedtls_ssl_read_record(ssl);
      if (iVar4 == -0x7280) {
        return 0;
      }
      if (iVar4 != 0) {
        pcVar7 = "mbedtls_ssl_read_record";
        iVar5 = 0x1915;
        goto LAB_00162903;
      }
    }
    if ((ssl->in_msglen == 0) && (ssl->in_msgtype == 0x17)) {
      iVar4 = mbedtls_ssl_read_record(ssl);
      if (iVar4 == -0x7280) {
        return 0;
      }
      if (iVar4 != 0) {
        pcVar7 = "mbedtls_ssl_read_record";
        iVar5 = 0x1925;
        goto LAB_00162903;
      }
    }
    if (ssl->in_msgtype == 0x16) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x192d,"received handshake message");
      uVar2 = *(uint *)&ssl->conf->field_0x164;
      if ((uVar2 & 1) == 0) {
        if ((*ssl->in_msg != '\0') || (ssl->in_hslen != (ulong)(uVar2 & 2) * 4 + 4)) {
          pcVar7 = "handshake received (not HelloRequest)";
          iVar4 = 0x1934;
LAB_00162bf5:
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,iVar4,pcVar7);
          if ((ssl->conf->field_0x164 & 2) == 0) {
            return -0x7700;
          }
          return -0x6900;
        }
      }
      else if (*ssl->in_msg != '\x01') {
        pcVar7 = "handshake received (not ClientHello)";
        iVar4 = 0x1941;
        goto LAB_00162bf5;
      }
      if (((uVar2 >> 0xe & 1) == 0) || ((uVar2 & 0x30) == 0 && ssl->secure_renegotiation == 0)) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x1951,"refusing renegotiation, sending alert");
        if (ssl->minor_ver == 0) {
          level = '\x02';
          message = '(';
        }
        else {
          if (ssl->minor_ver < 1) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x196d,"should never happen");
            return -0x6c00;
          }
          level = '\x01';
          message = 'd';
        }
        iVar5 = mbedtls_ssl_send_alert_message(ssl,level,message);
        iVar4 = -0x6900;
        if (iVar5 != 0) {
          iVar4 = iVar5;
        }
        if ((bool)(bVar3 | iVar5 != 0)) {
          return iVar4;
        }
      }
      else {
        if ((uVar2 & 3) == 2) {
          ssl->renego_status = 3;
        }
        iVar4 = ssl_start_renegotiation(ssl);
        if (iVar4 != -0x6b00) {
          if (iVar4 != 0) {
            pcVar7 = "ssl_start_renegotiation";
            iVar5 = 0x1982;
            goto LAB_00162903;
          }
          if (bVar3) {
            return -0x6900;
          }
        }
      }
LAB_00162c9d:
      if (ssl->in_msgtype == 0x17) {
        ssl->in_offt = ssl->in_msg;
        if (ssl->state == 0x10) {
          ssl_set_timer(ssl,0);
        }
        if ((((ssl->conf->field_0x164 & 1) != 0) && (ssl->renego_status == 3)) &&
           (iVar4 = ssl_resend_hello_request(ssl), iVar4 != 0)) {
          pcVar7 = "ssl_resend_hello_request";
          iVar5 = 0x19b9;
LAB_00162903:
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,iVar5,pcVar7,iVar4);
          return iVar4;
        }
        goto LAB_00162996;
      }
      if (ssl->in_msgtype == 0x15) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x199e,"ignoring non-fatal non-closure alert");
        return -0x6900;
      }
      pcVar7 = "bad application data message";
      iVar4 = 0x19a4;
    }
    else {
      if (((ssl->renego_status != 3) || (iVar4 = ssl->conf->renego_max_records, iVar4 < 0)) ||
         (iVar5 = ssl->renego_records_seen, ssl->renego_records_seen = iVar5 + 1, iVar5 < iVar4))
      goto LAB_00162c9d;
      pcVar7 = "renegotiation requested, but not honored by client";
      iVar4 = 0x1994;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,iVar4,pcVar7);
    iVar4 = -0x7700;
  }
  else {
LAB_00162996:
    if (ssl->in_msglen < len) {
      len = ssl->in_msglen;
    }
    memcpy(buf,ssl->in_offt,len);
    psVar1 = &ssl->in_msglen;
    *psVar1 = *psVar1 - len;
    if (*psVar1 == 0) {
      puVar6 = (uchar *)0x0;
    }
    else {
      puVar6 = ssl->in_offt + len;
    }
    ssl->in_offt = puVar6;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x19ce,"<= read");
    iVar4 = (int)len;
  }
  return iVar4;
}

Assistant:

int mbedtls_ssl_read( mbedtls_ssl_context *ssl, unsigned char *buf, size_t len )
{
    int ret, record_read = 0;
    size_t n;

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> read" ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
            return( ret );

        if( ssl->handshake != NULL &&
            ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
        {
            if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                return( ret );
        }
    }
#endif

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if( ( ret = ssl_check_ctr_renegotiate( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "ssl_check_ctr_renegotiate", ret );
        return( ret );
    }
#endif

    if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER )
    {
        ret = mbedtls_ssl_handshake( ssl );
        if( ret == MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO )
        {
            record_read = 1;
        }
        else if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_handshake", ret );
            return( ret );
        }
    }

    if( ssl->in_offt == NULL )
    {
        /* Start timer if not already running */
        if( ssl->f_get_timer != NULL &&
            ssl->f_get_timer( ssl->p_timer ) == -1 )
        {
            ssl_set_timer( ssl, ssl->conf->read_timeout );
        }

        if( ! record_read )
        {
            if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
            {
                if( ret == MBEDTLS_ERR_SSL_CONN_EOF )
                    return( 0 );

                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
                return( ret );
            }
        }

        if( ssl->in_msglen  == 0 &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_APPLICATION_DATA )
        {
            /*
             * OpenSSL sends empty messages to randomize the IV
             */
            if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
            {
                if( ret == MBEDTLS_ERR_SSL_CONN_EOF )
                    return( 0 );

                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
                return( ret );
            }
        }

#if defined(MBEDTLS_SSL_RENEGOTIATION)
        if( ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "received handshake message" ) );

#if defined(MBEDTLS_SSL_CLI_C)
            if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT &&
                ( ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_REQUEST ||
                  ssl->in_hslen != mbedtls_ssl_hs_hdr_len( ssl ) ) )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake received (not HelloRequest)" ) );

                /* With DTLS, drop the packet (probably from last handshake) */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
                if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
                    return( MBEDTLS_ERR_SSL_WANT_READ );
#endif
                return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
            }

            if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_CLIENT_HELLO )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake received (not ClientHello)" ) );

                /* With DTLS, drop the packet (probably from last handshake) */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
                if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
                    return( MBEDTLS_ERR_SSL_WANT_READ );
#endif
                return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
            }
#endif

            if( ssl->conf->disable_renegotiation == MBEDTLS_SSL_RENEGOTIATION_DISABLED ||
                ( ssl->secure_renegotiation == MBEDTLS_SSL_LEGACY_RENEGOTIATION &&
                  ssl->conf->allow_legacy_renegotiation ==
                                                MBEDTLS_SSL_LEGACY_NO_RENEGOTIATION ) )
            {
                MBEDTLS_SSL_DEBUG_MSG( 3, ( "refusing renegotiation, sending alert" ) );

#if defined(MBEDTLS_SSL_PROTO_SSL3)
                if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
                {
                    /*
                     * SSLv3 does not have a "no_renegotiation" alert
                     */
                    if( ( ret = mbedtls_ssl_send_fatal_handshake_failure( ssl ) ) != 0 )
                        return( ret );
                }
                else
#endif /* MBEDTLS_SSL_PROTO_SSL3 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
                if( ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_1 )
                {
                    if( ( ret = mbedtls_ssl_send_alert_message( ssl,
                                    MBEDTLS_SSL_ALERT_LEVEL_WARNING,
                                    MBEDTLS_SSL_ALERT_MSG_NO_RENEGOTIATION ) ) != 0 )
                    {
                        return( ret );
                    }
                }
                else
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 ||
          MBEDTLS_SSL_PROTO_TLS1_2 */
                {
                    MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
                    return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
                }
            }
            else
            {
                /* DTLS clients need to know renego is server-initiated */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
                if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
                    ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
                {
                    ssl->renego_status = MBEDTLS_SSL_RENEGOTIATION_PENDING;
                }
#endif
                ret = ssl_start_renegotiation( ssl );
                if( ret == MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO )
                {
                    record_read = 1;
                }
                else if( ret != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "ssl_start_renegotiation", ret );
                    return( ret );
                }
            }

            /* If a non-handshake record was read during renego, fallthrough,
             * else tell the user they should call mbedtls_ssl_read() again */
            if( ! record_read )
                return( MBEDTLS_ERR_SSL_WANT_READ );
        }
        else if( ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_PENDING )
        {

            if( ssl->conf->renego_max_records >= 0 )
            {
                if( ++ssl->renego_records_seen > ssl->conf->renego_max_records )
                {
                    MBEDTLS_SSL_DEBUG_MSG( 1, ( "renegotiation requested, "
                                        "but not honored by client" ) );
                    return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
                }
            }
        }
#endif /* MBEDTLS_SSL_RENEGOTIATION */

        /* Fatal and closure alerts handled by mbedtls_ssl_read_record() */
        if( ssl->in_msgtype == MBEDTLS_SSL_MSG_ALERT )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "ignoring non-fatal non-closure alert" ) );
            return( MBEDTLS_ERR_SSL_WANT_READ );
        }

        if( ssl->in_msgtype != MBEDTLS_SSL_MSG_APPLICATION_DATA )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad application data message" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
        }

        ssl->in_offt = ssl->in_msg;

        /* We're going to return something now, cancel timer,
         * except if handshake (renegotiation) is in progress */
        if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER )
            ssl_set_timer( ssl, 0 );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
        /* If we requested renego but received AppData, resend HelloRequest.
         * Do it now, after setting in_offt, to avoid taking this branch
         * again if ssl_write_hello_request() returns WANT_WRITE */
#if defined(MBEDTLS_SSL_SRV_C) && defined(MBEDTLS_SSL_RENEGOTIATION)
        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
            ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_PENDING )
        {
            if( ( ret = ssl_resend_hello_request( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_resend_hello_request", ret );
                return( ret );
            }
        }
#endif /* MBEDTLS_SSL_SRV_C && MBEDTLS_SSL_RENEGOTIATION */
#endif
    }

    n = ( len < ssl->in_msglen )
        ? len : ssl->in_msglen;

    memcpy( buf, ssl->in_offt, n );
    ssl->in_msglen -= n;

    if( ssl->in_msglen == 0 )
        /* all bytes consumed  */
        ssl->in_offt = NULL;
    else
        /* more data available */
        ssl->in_offt += n;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= read" ) );

    return( (int) n );
}